

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__process_child_init
               (uv_process_options_t *options,int *error_fd,int stdio_count,int (*pipes) [2])

{
  char **__envp;
  char *pcVar1;
  char **__argv;
  int iVar2;
  uint uVar3;
  __sighandler_t p_Var4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  uint *puVar11;
  int iVar12;
  int iVar13;
  int fd;
  ulong uVar14;
  char **ppcVar15;
  cpu_set_t cpuset;
  sigset_t signewset;
  cpu_set_t local_1238;
  sigset_t local_11b8;
  char local_1138 [4360];
  
  iVar12 = 1;
  do {
    if (((iVar12 != 9) && (iVar12 != 0x13)) &&
       (p_Var4 = signal(iVar12,(__sighandler_t)0x0), p_Var4 == (__sighandler_t)0xffffffffffffffff))
    goto LAB_0011eaba;
    iVar12 = iVar12 + 1;
  } while (iVar12 != 0x20);
  if ((options->flags & 8) != 0) {
    setsid();
  }
  if (0 < stdio_count) {
    uVar14 = 0;
    do {
      if ((uint)pipes[uVar14][1] < uVar14) {
        iVar12 = fcntl64((ulong)(uint)pipes[uVar14][1],0x406,stdio_count);
        pipes[uVar14][1] = iVar12;
        if (iVar12 == -1) goto LAB_0011e99b;
      }
      uVar14 = uVar14 + 1;
    } while ((uint)stdio_count != uVar14);
    if (0 < stdio_count) {
      iVar12 = 0;
      do {
        iVar2 = pipes[iVar12][1];
        if (iVar2 < 0) {
          if (iVar12 < 3) {
            uv__close_nocheckstdio(iVar12);
            iVar2 = open64("/dev/null",(uint)(iVar12 != 0) * 2);
            if (-1 < iVar2) {
              iVar13 = iVar2;
              fd = iVar12;
              if (iVar12 != iVar2) goto LAB_0011e89e;
              goto LAB_0011e8cc;
            }
            goto LAB_0011e99b;
          }
        }
        else {
          iVar13 = -1;
          if (iVar12 == iVar2) {
            iVar2 = uv__cloexec(iVar12,0);
            iVar13 = -1;
            if (iVar2 != 0) {
              *error_fd = iVar2;
              goto LAB_0011eac7;
            }
          }
          else {
LAB_0011e89e:
            iVar12 = dup2(iVar2,iVar12);
            if (iVar12 == -1) goto LAB_0011e99b;
          }
          fd = iVar13;
          if ((iVar12 < 3) && (iVar13 == -1)) {
            uv__nonblock_fcntl(iVar12,0);
            fd = -1;
          }
LAB_0011e8cc:
          if (stdio_count <= fd) {
            uv__close(fd);
          }
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < stdio_count);
    }
  }
  if ((options->cwd != (char *)0x0) && (iVar12 = chdir(options->cwd), iVar12 != 0)) {
LAB_0011e99b:
    piVar5 = __errno_location();
    *error_fd = -*piVar5;
    goto LAB_0011eac7;
  }
  uVar3 = options->flags;
  if ((uVar3 & 3) != 0) {
    piVar5 = __errno_location();
    iVar12 = *piVar5;
    setgroups(0,(__gid_t *)0x0);
    *piVar5 = iVar12;
    uVar3 = options->flags;
  }
  if ((uVar3 & 2) == 0) {
LAB_0011e937:
    if (((uVar3 & 1) == 0) || (iVar12 = setuid(options->uid), iVar12 == 0)) {
      if (options->cpumask != (char *)0x0) {
        uVar3 = uv_cpumask_size();
        if (options->cpumask_size < (ulong)(long)(int)uVar3) {
          __assert_fail("options->cpumask_size >= (size_t)cpumask_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                        ,0x221,
                        "void uv__process_child_init(const uv_process_options_t *, volatile int *, int, int (*)[2])"
                       );
        }
        local_1238.__bits[0xe] = 0;
        local_1238.__bits[0xf] = 0;
        local_1238.__bits[0xc] = 0;
        local_1238.__bits[0xd] = 0;
        local_1238.__bits[10] = 0;
        local_1238.__bits[0xb] = 0;
        local_1238.__bits[8] = 0;
        local_1238.__bits[9] = 0;
        local_1238.__bits[6] = 0;
        local_1238.__bits[7] = 0;
        local_1238.__bits[4] = 0;
        local_1238.__bits[5] = 0;
        local_1238.__bits[2] = 0;
        local_1238.__bits[3] = 0;
        local_1238.__bits[0] = 0;
        local_1238.__bits[1] = 0;
        if (0 < (int)uVar3) {
          pcVar1 = options->cpumask;
          uVar14 = 0;
          do {
            if ((uVar14 < 0x400) && (pcVar1[uVar14] != '\0')) {
              local_1238.__bits[uVar14 >> 6] =
                   local_1238.__bits[uVar14 >> 6] | 1L << ((byte)uVar14 & 0x3f);
            }
            uVar14 = uVar14 + 1;
          } while (uVar3 != uVar14);
        }
        iVar12 = sched_setaffinity(0,0x80,&local_1238);
        if (iVar12 != 0) {
          piVar5 = __errno_location();
          *error_fd = -*piVar5;
          goto LAB_0011eac7;
        }
      }
      sigemptyset(&local_11b8);
      iVar12 = sigprocmask(2,&local_11b8,(sigset_t *)0x0);
      if (iVar12 != 0) {
        abort();
      }
      __envp = options->env;
      pcVar1 = options->file;
      __argv = options->args;
      if (__envp == (char **)0x0) {
        execvp(pcVar1,__argv);
      }
      else if (pcVar1 != (char *)0x0) {
        pcVar6 = strchr(pcVar1,0x2f);
        if (pcVar6 == (char *)0x0) {
          if (_environ == __envp) {
            execvpe(pcVar1,__argv,__envp);
          }
          else {
            pcVar6 = *__envp;
            if (pcVar6 == (char *)0x0) {
              pcVar9 = (char *)0x0;
            }
            else {
              pcVar9 = (char *)0x0;
              ppcVar15 = __envp;
              do {
                ppcVar15 = ppcVar15 + 1;
                iVar12 = strncmp(pcVar6,"PATH=",5);
                if (iVar12 == 0) {
                  pcVar9 = pcVar6 + 5;
                  break;
                }
                pcVar6 = *ppcVar15;
              } while (pcVar6 != (char *)0x0);
            }
            sVar7 = strnlen(pcVar1,0x100);
            if (sVar7 < 0x100) {
              pcVar6 = "/usr/bin:/bin";
              if (pcVar9 != (char *)0x0) {
                pcVar6 = pcVar9;
              }
              sVar8 = strnlen(pcVar6,0xfff);
              do {
                pcVar9 = strchr(pcVar6,0x3a);
                if (pcVar9 == (char *)0x0) {
                  sVar10 = strlen(pcVar6);
                  pcVar9 = pcVar6 + sVar10;
                }
                uVar14 = (long)pcVar9 - (long)pcVar6;
                if (uVar14 < sVar8 + 1) {
                  memcpy(local_1138,pcVar6,uVar14);
                  local_1138[uVar14] = '/';
                  memcpy(local_1138 + (pcVar6 < pcVar9) + uVar14,pcVar1,sVar7 + 1);
                  execve(local_1138,__argv,__envp);
                  puVar11 = (uint *)__errno_location();
                  if ((0x14 < *puVar11) || ((0x102004U >> (*puVar11 & 0x1f) & 1) == 0)) break;
                }
                if (*pcVar9 == '\0') break;
                pcVar6 = pcVar9 + 1;
              } while( true );
            }
          }
        }
        else {
          execve(pcVar1,__argv,__envp);
        }
      }
    }
  }
  else {
    iVar12 = setgid(options->gid);
    if (iVar12 == 0) {
      uVar3 = options->flags;
      goto LAB_0011e937;
    }
  }
LAB_0011eaba:
  piVar5 = __errno_location();
  *error_fd = -*piVar5;
LAB_0011eac7:
  _exit(0x7f);
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
#ifdef __linux__
                                   volatile int* error_fd,
#else
                                   int error_fd,
#endif
                                   int stdio_count,
                                   int (*pipes)[2]) {
  sigset_t signewset;
  int close_fd;
  int use_fd;
  int fd;
  int n;
#if defined(__linux__) || defined(__FreeBSD__)
  int i;
  int cpumask_size;
  uv__cpu_set_t cpuset;
#endif

  /* Reset signal disposition first. Use a hard-coded limit because NSIG is not
   * fixed on Linux: it's either 32, 34 or 64, depending on whether RT signals
   * are enabled. We are not allowed to touch RT signal handlers, glibc uses
   * them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
#ifdef F_DUPFD_CLOEXEC /* POSIX 2008 */
    pipes[fd][1] = fcntl(use_fd, F_DUPFD_CLOEXEC, stdio_count);
#else
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
#endif
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
#ifndef F_DUPFD_CLOEXEC /* POSIX 2008 */
    n = uv__cloexec(pipes[fd][1], 1);
    if (n)
      uv__write_int(error_fd, n);
#endif
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = -1;
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* Redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set. */
        uv__close_nocheckstdio(fd); /* Free up fd, if it happens to be open. */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd) {
      if (close_fd == -1) {
        n = uv__cloexec(use_fd, 0);
        if (n)
          uv__write_int(error_fd, n);
      }
    }
    else {
      fd = dup2(use_fd, fd);
    }

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2 && close_fd == -1)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

#if defined(__linux__) || defined(__FreeBSD__)
  if (options->cpumask != NULL) {
    cpumask_size = uv_cpumask_size();
    assert(options->cpumask_size >= (size_t)cpumask_size);

    CPU_ZERO(&cpuset);
    for (i = 0; i < cpumask_size; ++i) {
      if (options->cpumask[i]) {
        CPU_SET(i, &cpuset);
      }
    }

#if defined(__linux__)
    /* Avoid using pthread calls when using vfork. */
    if (sched_setaffinity(0, sizeof(cpuset), &cpuset))
      uv__write_errno(error_fd);
#else
    n = pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
    if (n)
      uv__write_int(error_fd, UV__ERR(n));
#endif
  }
#endif

  /* Reset signal mask just before exec. */
  sigemptyset(&signewset);
  if (sigprocmask(SIG_SETMASK, &signewset, NULL) != 0)
    abort();

#ifdef __linux__
  if (options->env != NULL) {
    uv__execvpe(options->file, options->args, options->env);
  } else {
    execvp(options->file, options->args);
  }
#else
  if (options->env != NULL) {
    environ = options->env;
  }

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif
#endif

  uv__write_errno(error_fd);
}